

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O2

void anon_unknown.dwarf_2c2adb::fillPixelsGray(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  uint16_t uVar1;
  Rgba *pRVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int x;
  ulong uVar8;
  double dVar9;
  double dVar10;
  long local_60;
  
  uVar7 = (ulong)(uint)w;
  if (w < 1) {
    uVar7 = 0;
  }
  local_60 = 0;
  uVar4 = (ulong)(uint)h;
  if (h < 1) {
    uVar4 = 0;
  }
  for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    lVar5 = 6;
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      lVar6 = pixels->_sizeY * local_60;
      pRVar2 = pixels->_data;
      dVar9 = (double)(int)uVar8 * 0.05 + (double)(int)uVar3 * -0.05;
      dVar10 = sin(dVar9);
      Imath_3_2::half::operator=
                ((half *)((long)pRVar2 + lVar5 + lVar6 + -6),(float)(dVar10 * 0.5 + 0.8));
      uVar1 = *(uint16_t *)((long)&pRVar2[uVar8].r._h + lVar6);
      *(uint16_t *)((long)&pRVar2[uVar8].g._h + lVar6) = uVar1;
      *(uint16_t *)((long)&pRVar2[uVar8].b._h + lVar6) = uVar1;
      dVar9 = cos(dVar9);
      Imath_3_2::half::operator=
                ((half *)((long)&(pRVar2->r)._h + lVar5 + lVar6),(float)(dVar9 * 0.5 + 0.5));
      lVar5 = lVar5 + 8;
    }
    local_60 = local_60 + 8;
  }
  return;
}

Assistant:

void
fillPixelsGray (Array2D<Rgba>& pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];

            p.r = 0.8 + 0.5 * sin (x * 0.05 - y * 0.05);
            p.g = p.r;
            p.b = p.r;
            p.a = 0.5 + 0.5 * cos (x * 0.05 - y * 0.05);
        }
    }
}